

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d.cpp
# Opt level: O1

int __thiscall
ncnn::Convolution1D::forward(Convolution1D *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int *piVar1;
  int iVar2;
  Option *opt_00;
  Mat bottom_blob_bordered;
  
  bottom_blob_bordered.cstep = 0;
  bottom_blob_bordered.data = (void *)0x0;
  bottom_blob_bordered.refcount._0_4_ = 0;
  bottom_blob_bordered.refcount._4_4_ = 0;
  bottom_blob_bordered.elemsize._0_4_ = 0;
  bottom_blob_bordered.elemsize._4_4_ = 0;
  bottom_blob_bordered.elempack = 0;
  bottom_blob_bordered.allocator = (Allocator *)0x0;
  bottom_blob_bordered.dims = 0;
  bottom_blob_bordered.w = 0;
  bottom_blob_bordered.h = 0;
  bottom_blob_bordered.d = 0;
  bottom_blob_bordered.c = 0;
  make_padding(this,bottom_blob,&bottom_blob_bordered,this->kernel_w,opt);
  iVar2 = -100;
  if ((bottom_blob_bordered.data != (void *)0x0) &&
     ((long)bottom_blob_bordered.c * bottom_blob_bordered.cstep != 0)) {
    opt_00 = (Option *)0x306803;
    Mat::create(top_blob,(~((this->kernel_w + -1) * this->dilation_w) + bottom_blob_bordered.w) /
                         this->stride_w + 1,this->num_output,
                CONCAT44(bottom_blob_bordered.elemsize._4_4_,
                         (undefined4)bottom_blob_bordered.elemsize),opt->blob_allocator);
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      convolution1d(&bottom_blob_bordered,top_blob,&this->weight_data,&this->bias_data,
                    this->kernel_w,this->stride_w,this->dilation_w,this->activation_type,
                    &this->activation_params,opt_00);
      iVar2 = 0;
    }
  }
  piVar1 = (int *)CONCAT44(bottom_blob_bordered.refcount._4_4_,bottom_blob_bordered.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (bottom_blob_bordered.allocator == (Allocator *)0x0) {
        if (bottom_blob_bordered.data != (void *)0x0) {
          free(bottom_blob_bordered.data);
        }
      }
      else {
        (*(bottom_blob_bordered.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar2;
}

Assistant:

int Convolution1D::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    const int w = bottom_blob_bordered.w;
    const size_t elemsize = bottom_blob_bordered.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;

    const int outw = (w - kernel_extent_w) / stride_w + 1;

    top_blob.create(outw, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    int ret = convolution1d(bottom_blob_bordered, top_blob, weight_data, bias_data, kernel_w, stride_w, dilation_w, activation_type, activation_params, opt);
    if (ret != 0)
        return ret;

    return 0;
}